

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.hpp
# Opt level: O3

void __thiscall
pstore::command_line::help<std::basic_ostream<char,_std::char_traits<char>_>_>::
help<pstore::command_line::name>
          (help<std::basic_ostream<char,_std::char_traits<char>_>_> *this,string *program_name,
          string *program_overview,basic_ostream<char,_std::char_traits<char>_> *outs,name *mods)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  option::option(&this->super_option);
  (this->super_option)._vptr_option = (_func_int **)&PTR__help_001196d8;
  paVar2 = &(this->program_name_).field_2;
  (this->program_name_)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (program_name->_M_dataplus)._M_p;
  paVar1 = &program_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&program_name->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->program_name_).field_2 + 8) = uVar4;
  }
  else {
    (this->program_name_)._M_dataplus._M_p = pcVar3;
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->program_name_)._M_string_length = program_name->_M_string_length;
  (program_name->_M_dataplus)._M_p = (pointer)paVar1;
  program_name->_M_string_length = 0;
  (program_name->field_2)._M_local_buf[0] = '\0';
  paVar2 = &(this->overview_).field_2;
  (this->overview_)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (program_overview->_M_dataplus)._M_p;
  paVar1 = &program_overview->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&program_overview->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->overview_).field_2 + 8) = uVar4;
  }
  else {
    (this->overview_)._M_dataplus._M_p = pcVar3;
    (this->overview_).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->overview_)._M_string_length = program_overview->_M_string_length;
  (program_overview->_M_dataplus)._M_p = (pointer)paVar1;
  program_overview->_M_string_length = 0;
  (program_overview->field_2)._M_local_buf[0] = '\0';
  this->outs_ = outs;
  option::set_name(&this->super_option,&mods->name_);
  return;
}

Assistant:

explicit help (std::string program_name, std::string program_overview,
                           OutputStream & outs, Mods const &... mods)
                    : program_name_{std::move (program_name)}
                    , overview_{std::move (program_overview)}
                    , outs_{outs} {

                apply_to_option (*this, mods...);
            }